

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O3

string * __thiscall
lest::to_string<int,double>(string *__return_storage_ptr__,lest *this,pair<int,_double> *pair)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ostream *poVar2;
  int *value;
  double *value_00;
  ostringstream oss;
  string local_200;
  size_type *local_1e0;
  size_type local_1d8;
  size_type local_1d0;
  undefined8 uStack_1c8;
  size_type *local_1c0;
  size_type local_1b8;
  size_type local_1b0;
  undefined8 uStack_1a8;
  ostringstream local_1a0 [112];
  ios_base local_130 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"{ ",2);
  string_maker<int>::to_string_abi_cxx11_(&local_200,(string_maker<int> *)this,value);
  paVar1 = &local_200.field_2;
  local_1c0 = (size_type *)local_200._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p == paVar1) {
    uStack_1a8 = local_200.field_2._8_8_;
    local_1c0 = &local_1b0;
  }
  local_1b0 = local_200.field_2._M_allocated_capacity;
  local_1b8 = local_200._M_string_length;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a0,(char *)local_1c0,local_200._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
  string_maker<double>::to_string_abi_cxx11_(&local_200,(string_maker<double> *)(this + 8),value_00)
  ;
  local_1e0 = (size_type *)local_200._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p == paVar1) {
    uStack_1c8 = local_200.field_2._8_8_;
    local_1e0 = &local_1d0;
  }
  local_1d0 = local_200.field_2._M_allocated_capacity;
  local_1d8 = local_200._M_string_length;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(char *)local_1e0,local_200._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," }",2);
  if (local_1e0 != &local_1d0) {
    operator_delete(local_1e0,local_1d0 + 1);
  }
  if (local_1c0 != &local_1b0) {
    operator_delete(local_1c0,local_1b0 + 1);
  }
  std::__cxx11::stringbuf::str();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p == paVar1) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         local_200.field_2._M_allocated_capacity;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_200.field_2._8_8_;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = local_200._M_dataplus._M_p;
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         local_200.field_2._M_allocated_capacity;
  }
  __return_storage_ptr__->_M_string_length = local_200._M_string_length;
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  std::ios_base::~ios_base(local_130);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string( std::pair<T1,T2> const & pair )
{
    std::ostringstream oss;
    oss << "{ " << to_string( pair.first ) << ", " << to_string( pair.second ) << " }";
    return oss.str();
}